

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void com_ipred_l(pel *src,pel *dst,int i_dst,pel *tmp_buf,int ipm,int w,int h,int bit_depth,
                u16 avail_cu,u8 ipf_flag)

{
  _func_void_pel_ptr_pel_ptr_int_int_int_int *UNRECOVERED_JUMPTABLE;
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  if (ipm - 3U < 0xfffffffe) {
    if (ipm == 0) {
      (*uavs3d_funs_handle.intra_pred_dc[0])(src,dst,i_dst,w,h,avail_cu,bit_depth);
    }
    else if (ipm == 0x18) {
      (*uavs3d_funs_handle.intra_pred_hor[0])(src + -1,dst,i_dst,w,h);
    }
    else if (ipm == 0xc) {
      (*uavs3d_funs_handle.intra_pred_ver[0])(src + 1,dst,i_dst,w,h);
    }
    else {
      (*uavs3d_funs_handle.intra_pred_ang[ipm])(src,dst,i_dst,ipm,w,h);
    }
    if (ipf_flag != '\0') {
      iVar3 = 10;
      if (h < 10) {
        iVar3 = h;
      }
      iVar2 = 10;
      if (w < 10) {
        iVar2 = w;
      }
      iVar4 = 0;
      lVar1 = (long)g_tbl_log2[h] + -2;
      if (6 < (long)g_tbl_log2[h]) {
        iVar3 = iVar4;
        lVar1 = 4;
      }
      if (ipm - 3U < 0x10) {
        iVar3 = iVar4;
      }
      lVar5 = (long)g_tbl_log2[w] + -2;
      if (6 < (long)g_tbl_log2[w]) {
        iVar2 = iVar4;
        lVar5 = 4;
      }
      if (0x12 < ipm) {
        iVar2 = iVar4;
      }
      (*uavs3d_funs_handle.intra_pred_ipf)
                (src,dst,i_dst,iVar2,iVar3,g_ipf_pred_param[lVar5],g_ipf_pred_param[lVar1],w,h,
                 bit_depth);
    }
  }
  else {
    if (ipf_flag == '\0') {
      UNRECOVERED_JUMPTABLE = uavs3d_funs_handle.intra_pred_bi[0];
      if (ipm == 1) {
        UNRECOVERED_JUMPTABLE = uavs3d_funs_handle.intra_pred_plane[0];
      }
      (*UNRECOVERED_JUMPTABLE)(src,dst,i_dst,w,h,bit_depth);
      return;
    }
    (*uavs3d_funs_handle.intra_pred_bi[(ulong)(ipm != 1) + 2])(src,tmp_buf,w,h,0x196390,w);
    iVar3 = h;
    if (9 < h) {
      iVar3 = 10;
    }
    lVar1 = (long)g_tbl_log2[w];
    iVar2 = 10;
    if (w < 10) {
      iVar2 = w;
    }
    if (6 < lVar1) {
      iVar2 = 0;
    }
    lVar5 = lVar1 + -2;
    if (6 < lVar1) {
      lVar5 = 4;
    }
    lVar1 = (long)g_tbl_log2[h];
    if (6 < lVar1) {
      iVar3 = 0;
    }
    lVar6 = lVar1 + -2;
    if (6 < lVar1) {
      lVar6 = 4;
    }
    (*uavs3d_funs_handle.intra_pred_ipf_s16)
              (src,dst,i_dst,(s16 *)tmp_buf,iVar2,iVar3,g_ipf_pred_param[lVar5],
               g_ipf_pred_param[lVar6],w,h,bit_depth);
  }
  return;
}

Assistant:

void com_ipred_l(pel *src, pel *dst, int i_dst, pel *tmp_buf, int ipm, int w, int h, int bit_depth, u16 avail_cu, u8 ipf_flag)
{
    uavs3d_assert(w <= 64 && h <= 64);
  
    if (ipm != IPD_PLN && ipm != IPD_BI) {
        switch (ipm) {
        case IPD_VER:
            uavs3d_funs_handle.intra_pred_ver[Y_C](src + 1, dst, i_dst, w, h);
            break;
        case IPD_HOR:
            uavs3d_funs_handle.intra_pred_hor[Y_C](src - 1, dst, i_dst, w, h);
            break;
        case IPD_DC:
            uavs3d_funs_handle.intra_pred_dc[Y_C](src, dst, i_dst, w, h, avail_cu, bit_depth);
            break;
        default:
            uavs3d_funs_handle.intra_pred_ang[ipm](src, dst, i_dst, ipm, w, h);
            break;
        }
        if (ipf_flag) {
            uavs3d_assert((w < MAX_CU_SIZE) && (h < MAX_CU_SIZE));
            ipf_core(src, dst, i_dst, ipm, w, h, bit_depth);
        }
    } else {
        if (ipf_flag) {
            switch (ipm) {
            case IPD_PLN:
                uavs3d_funs_handle.intra_pred_plane_ipf(src, (s16*)tmp_buf, w, h);
                break;
            case IPD_BI:
                uavs3d_funs_handle.intra_pred_bi_ipf(src, (s16*)tmp_buf, w, h);
                break;
            }
            uavs3d_assert((w < MAX_CU_SIZE) && (h < MAX_CU_SIZE));
            ipf_core_s16(src, dst, i_dst, (s16*)tmp_buf, ipm, w, h, bit_depth);
        } else {
            switch (ipm) {
            case IPD_PLN:
                uavs3d_funs_handle.intra_pred_plane[Y_C](src, dst, i_dst, w, h, bit_depth);
                break;
            case IPD_BI:
                uavs3d_funs_handle.intra_pred_bi[Y_C](src, dst, i_dst, w, h, bit_depth);
                break;
            }
        }
    }
}